

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_indent_abi_cxx11_
          (serializer<toml::type_config> *this,indent_char indent_type)

{
  int *piVar1;
  char in_DL;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char in_stack_ffffffffffffffa7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  long local_20;
  char local_11;
  
  local_24 = 0;
  local_11 = in_DL;
  piVar1 = CLI::std::max<int>(&local_24,(int *)(in_RSI + 0x1c));
  local_20 = (long)*piVar1;
  if (local_11 == '\0') {
    this_00 = &local_48;
    make_string_abi_cxx11_((size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7);
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string(this_00);
  }
  else if (local_11 == '\x01') {
    make_string_abi_cxx11_((size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7);
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string(in_stack_ffffffffffffff70);
  }
  else {
    std::__cxx11::string::string(in_RDI);
  }
  return (string_type *)in_RDI;
}

Assistant:

string_type format_indent(const indent_char indent_type) const // {{{
    {
        const auto indent = static_cast<std::size_t>((std::max)(0, this->current_indent_));
        if(indent_type == indent_char::space)
        {
            return string_conv<string_type>(make_string(indent, ' '));
        }
        else if(indent_type == indent_char::tab)
        {
            return string_conv<string_type>(make_string(indent, '\t'));
        }
        else
        {
            return string_type{};
        }
    }